

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DBSCAN.cpp
# Opt level: O2

void __thiscall DBSCAN::SetArrivalEmbs(DBSCAN *this,Embedding *emb)

{
  long lVar1;
  Embedding *this_00;
  ulong uVar2;
  float fVar3;
  uint local_109c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1098;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1090;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1088;
  Embedding local_1080;
  Embedding local_858;
  
  local_1098 = &local_1080.arrival_embs;
  local_1090 = &local_858.arrival_embs;
  local_1088 = &emb->arrival_embs;
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < this->emb_num; uVar2 = uVar2 + 1) {
    Embedding::Embedding
              (&local_858,
               (Embedding *)
               ((long)((this->embs).super__Vector_base<Embedding,_std::allocator<Embedding>_>.
                       _M_impl.super__Vector_impl_data._M_start)->emb + lVar1 + -4));
    this_00 = &local_1080;
    Embedding::Embedding(&local_1080,emb);
    fVar3 = GetDistance((DBSCAN *)this_00,&local_858,&local_1080);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&local_1098->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&local_1090->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    if ((this->radius <= fVar3) && (uVar2 != emb->emb_id)) {
      local_109c = (uint)uVar2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (local_1088,&local_109c);
    }
    lVar1 = lVar1 + 0x828;
  }
  emb->is_key = (ulong)this->min_embs <=
                (ulong)((long)(emb->arrival_embs).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(emb->arrival_embs).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2);
  return;
}

Assistant:

void DBSCAN::SetArrivalEmbs(Embedding& emb)
{
    for(unsigned long i=0; i<this->emb_num; i++)                //对每个数据点执行
    {
        float distance = this->GetDistance(embs[i], emb);    //获取与特定点之间的距离
        if(distance >= radius && i!=emb.GetEmbID())        //若距离小于半径，并且特定点的id与dp的id不同执行
            emb.GetArrivalEmbs().push_back(i);            //将特定点id压力dp的领域列表中
    }
    if(emb.GetArrivalEmbs().size() >= this->min_embs)            //若dp领域内数据点数据量> minPTs执行
    {
        emb.SetKey(true);    //将dp核心对象标志位设为true
        return;                //返回
    }
    emb.SetKey(false);    //若非核心对象，则将dp核心对象标志位设为false
}